

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O1

uint64_t helper_float_ceil_2008_l_s_mips(CPUMIPSState *env,uint32_t fst0)

{
  byte bVar1;
  uint uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint uVar5;
  uint uVar6;
  uintptr_t unaff_retaddr;
  
  (env->active_fpu).fp_status.float_rounding_mode = '\x02';
  uVar3 = float32_to_int64_mips(fst0,&(env->active_fpu).fp_status);
  uVar2 = (env->active_fpu).fcr31;
  (env->active_fpu).fp_status.float_rounding_mode = (char)ieee_rm_mips[uVar2 & 3];
  bVar1 = (env->active_fpu).fp_status.float_exception_flags;
  if (bVar1 == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = bVar1 >> 5 & 1 | (bVar1 >> 3 & 2 | bVar1 >> 1 & 4 | (bVar1 & 1) << 4) + (bVar1 & 4) * 2;
  }
  uVar6 = uVar5 << 0xc | uVar2 & 0xfffc0fff;
  (env->active_fpu).fcr31 = uVar6;
  if (uVar5 != 0) {
    (env->active_fpu).fp_status.float_exception_flags = '\0';
    if ((uVar2 >> 7 & uVar5) != 0) {
      do_raise_exception(env,0x17,unaff_retaddr);
    }
    (env->active_fpu).fcr31 = uVar6 | uVar5 << 2;
  }
  uVar4 = 0;
  if ((fst0 & 0x7fffffff) < 0x7f800001) {
    uVar4 = uVar3;
  }
  if ((bVar1 & 1) == 0) {
    uVar4 = uVar3;
  }
  return uVar4;
}

Assistant:

uint64_t helper_float_ceil_2008_l_s(CPUMIPSState *env, uint32_t fst0)
{
    uint64_t dt2;

    set_float_rounding_mode(float_round_up, &env->active_fpu.fp_status);
    dt2 = float32_to_int64(fst0, &env->active_fpu.fp_status);
    restore_rounding_mode(env);
    if (get_float_exception_flags(&env->active_fpu.fp_status)
            & float_flag_invalid) {
        if (float32_is_any_nan(fst0)) {
            dt2 = 0;
        }
    }
    update_fcr31(env, GETPC());
    return dt2;
}